

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_check_interval_option
              (rtr_socket *rtr_socket,int interval_mode,uint32_t interval,rtr_interval_type type)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (type == RTR_INTERVAL_TYPE_RETRY) {
    bVar5 = interval == 0;
    uVar2 = 1;
    uVar4 = 0x1c20;
  }
  else if (type == RTR_INTERVAL_TYPE_REFRESH) {
    bVar5 = interval == 0;
    uVar2 = 1;
    uVar4 = 0x15180;
  }
  else {
    if (type != RTR_INTERVAL_TYPE_EXPIRATION) {
      lrtr_dbg("RTR Socket: Invalid interval type: %u.",(ulong)type);
      iVar3 = -1;
      goto LAB_0010999b;
    }
    bVar5 = interval < 600;
    uVar2 = 600;
    uVar4 = 0x2a300;
  }
  if ((interval_mode == 1) || ((bool)(interval <= uVar4 & (bVar5 ^ 1U)))) {
    if (type == RTR_INTERVAL_TYPE_RETRY) {
      rtr_socket->retry_interval = interval;
    }
    else if (type == RTR_INTERVAL_TYPE_REFRESH) {
      rtr_socket->refresh_interval = interval;
    }
    else {
      rtr_socket->expire_interval = interval;
    }
  }
  else {
    if (interval_mode != 2) {
      iVar3 = 0;
      lrtr_dbg("RTR Socket: Received expiration value out of range. Was %u. It will be ignored.",
               (ulong)interval);
      goto LAB_0010999b;
    }
    if (bVar5) {
      if (type == RTR_INTERVAL_TYPE_RETRY) {
        rtr_socket->retry_interval = uVar2;
      }
      else if (type == RTR_INTERVAL_TYPE_REFRESH) {
        rtr_socket->refresh_interval = uVar2;
      }
      else {
        rtr_socket->expire_interval = uVar2;
      }
    }
    else if (type == RTR_INTERVAL_TYPE_RETRY) {
      rtr_socket->retry_interval = uVar4;
    }
    else if (type == RTR_INTERVAL_TYPE_REFRESH) {
      rtr_socket->refresh_interval = uVar4;
    }
    else {
      rtr_socket->expire_interval = uVar4;
    }
  }
  iVar3 = 0;
LAB_0010999b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_check_interval_option(struct rtr_socket *rtr_socket, int interval_mode, uint32_t interval,
			      enum rtr_interval_type type)
{
	uint16_t minimum;
	uint32_t maximum;

	int interv_retval;

	switch (type) {
	case RTR_INTERVAL_TYPE_EXPIRATION:
		minimum = RTR_EXPIRATION_MIN;
		maximum = RTR_EXPIRATION_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	case RTR_INTERVAL_TYPE_REFRESH:
		minimum = RTR_REFRESH_MIN;
		maximum = RTR_REFRESH_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	case RTR_INTERVAL_TYPE_RETRY:
		minimum = RTR_RETRY_MIN;
		maximum = RTR_RETRY_MAX;
		interv_retval = rtr_check_interval_range(interval, minimum, maximum);
		break;
	default:
		RTR_DBG("Invalid interval type: %u.", type);
		return RTR_ERROR;
	}

	if (interv_retval == RTR_INSIDE_INTERVAL_RANGE || interval_mode == RTR_INTERVAL_MODE_ACCEPT_ANY) {
		apply_interval_value(rtr_socket, interval, type);
	} else if (interval_mode == RTR_INTERVAL_MODE_DEFAULT_MIN_MAX) {
		if (interv_retval == RTR_BELOW_INTERVAL_RANGE)
			apply_interval_value(rtr_socket, minimum, type);
		else
			apply_interval_value(rtr_socket, maximum, type);
	} else {
		RTR_DBG("Received expiration value out of range. Was %u. It will be ignored.", interval);
	}

	return RTR_SUCCESS;
}